

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeBatchResult.cpp
# Opt level: O1

TestCaseResultPtr __thiscall xe::BatchResult::createTestCaseResult(BatchResult *this,char *casePath)

{
  long lVar1;
  long lVar2;
  mapped_type *pmVar3;
  string *this_00;
  undefined8 *puVar4;
  char *in_RDX;
  SharedPtrStateBase *extraout_RDX;
  TestCaseResultPtr TVar5;
  allocator<char> local_49;
  key_type local_48;
  
  std::
  vector<de::SharedPtr<xe::TestCaseResultData>,_std::allocator<de::SharedPtr<xe::TestCaseResultData>_>_>
  ::reserve((vector<de::SharedPtr<xe::TestCaseResultData>,_std::allocator<de::SharedPtr<xe::TestCaseResultData>_>_>
             *)(casePath + 0xe0),(*(long *)(casePath + 0xe8) - *(long *)(casePath + 0xe0) >> 4) + 1)
  ;
  lVar1 = *(long *)(casePath + 0xe8);
  lVar2 = *(long *)(casePath + 0xe0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,in_RDX,&local_49);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                         *)(casePath + 0xf8),&local_48);
  *pmVar3 = (mapped_type)((ulong)(lVar1 - lVar2) >> 4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  this_00 = (string *)operator_new(0x60);
  std::__cxx11::string::string<std::allocator<char>>(this_00,in_RDX,(allocator<char> *)&local_48);
  *(undefined4 *)(this_00 + 0x20) = 0xe;
  *(string **)(this_00 + 0x28) = this_00 + 0x38;
  *(undefined8 *)(this_00 + 0x30) = 0;
  this_00[0x38] = (string)0x0;
  *(undefined8 *)(this_00 + 0x48) = 0;
  *(undefined8 *)(this_00 + 0x50) = 0;
  *(undefined8 *)(this_00 + 0x58) = 0;
  (this->m_sessionInfo).releaseName._M_dataplus._M_p = (pointer)0x0;
  (this->m_sessionInfo).releaseName._M_string_length = 0;
  (this->m_sessionInfo).releaseName._M_dataplus._M_p = (pointer)this_00;
  puVar4 = (undefined8 *)operator_new(0x20);
  *(undefined4 *)(puVar4 + 1) = 0;
  *(undefined4 *)((long)puVar4 + 0xc) = 0;
  *puVar4 = &PTR__SharedPtrState_00150860;
  puVar4[2] = this_00;
  (this->m_sessionInfo).releaseName._M_string_length = (size_type)puVar4;
  *(undefined4 *)(puVar4 + 1) = 1;
  *(undefined4 *)((long)puVar4 + 0xc) = 1;
  std::
  vector<de::SharedPtr<xe::TestCaseResultData>,_std::allocator<de::SharedPtr<xe::TestCaseResultData>_>_>
  ::push_back((vector<de::SharedPtr<xe::TestCaseResultData>,_std::allocator<de::SharedPtr<xe::TestCaseResultData>_>_>
               *)(casePath + 0xe0),(value_type *)this);
  TVar5.m_state = extraout_RDX;
  TVar5.m_ptr = (TestCaseResultData *)this;
  return TVar5;
}

Assistant:

TestCaseResultPtr BatchResult::createTestCaseResult (const char* casePath)
{
	DE_ASSERT(!hasTestCaseResult(casePath));

	m_testCaseResults.reserve(m_testCaseResults.size()+1);
	m_resultMap[casePath] = (int)m_testCaseResults.size();

	TestCaseResultPtr caseResult(new TestCaseResultData(casePath));
	m_testCaseResults.push_back(caseResult);

	return caseResult;
}